

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)2>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  map *this_01;
  mapped_type *pmVar2;
  
  (frame->
  super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
  ).result.type = it._M_current[1].type;
  std::__cxx11::string::_M_assign
            ((string *)
             &(frame->
              super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
              ).result.val);
  this = &(frame->
          super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
          ).result.list;
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  operator=(this,&it._M_current[1].list);
  peVar1 = it._M_current[1].env.
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (frame->
  super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
  ).result.proc = it._M_current[1].proc;
  (frame->
  super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
  ).result.env.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  this_00 = &(frame->
             super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
             ).result.env.
             super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&it._M_current[1].env.
                      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  this_01 = environment::find((frame->
                              super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                              ).env.
                              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,&(it._M_current)->val);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>_>_>
           ::operator[](this_01,&(it._M_current)->val);
  pmVar2->type = (frame->
                 super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                 ).result.type;
  std::__cxx11::string::_M_assign((string *)&pmVar2->val);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  operator=(&pmVar2->list,this);
  peVar1 = (frame->
           super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
           ).result.env.
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pmVar2->proc = (frame->
                 super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                 ).result.proc;
  (pmVar2->env).super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar2->env).
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  return true;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		const cell &var = *it; ++it;
		const cell &val = *it; ++it;
		frame.lookup(var.val) = frame.result = val;
		return true;
	}